

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O1

string * __thiscall
front::word::Word::get_token_string_abi_cxx11_(string *__return_storage_ptr__,Word *this)

{
  long lVar1;
  
  lVar1 = (long)(int)this->token_value * 0x20;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(Token_strs_abi_cxx11_ + lVar1),
             *(long *)(Token_strs_abi_cxx11_ + lVar1 + 8) + *(long *)(Token_strs_abi_cxx11_ + lVar1)
            );
  return __return_storage_ptr__;
}

Assistant:

string Word::get_token_string() { return Token_strs[(int)token_value]; }